

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_grzip.c
# Opt level: O0

void test_option_grzip(void)

{
  wchar_t wVar1;
  ulong local_18;
  size_t s;
  char *p;
  
  wVar1 = canGrzip();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_grzip.c"
                   ,L'\x10');
    test_skipping("grzip is not supported on this platform");
  }
  else {
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_grzip.c"
                        ,L'\x15',"f",L'Ƥ',L'\xffffffff',"a");
    wVar1 = systemf("echo f | %s -o --grzip >archive.out 2>archive.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_grzip.c"
                        ,L'\x1a',0,"0",(long)wVar1,
                        "systemf(\"echo f | %s -o --grzip >archive.out 2>archive.err\", testprog)",
                        (void *)0x0);
    s = (size_t)slurpfile(&local_18,"archive.err");
    free((void *)s);
    s = (size_t)slurpfile(&local_18,"archive.out");
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_grzip.c"
                     ,L'\x1f',(uint)(2 < local_18),"s > 2",(void *)0x0);
    assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/cpio/test/test_option_grzip.c"
                        ,L' ',(void *)s,"p","GRZipII","\"GRZipII\\x00\\x02\\x04:)\"",0xc,"12",
                        (void *)0x0);
    free((void *)s);
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_grzip)
{
	char *p;
	size_t s;

	if (!canGrzip()) {
		skipping("grzip is not supported on this platform");
		return;
	}

	/* Create a file. */
	assertMakeFile("f", 0644, "a");

	/* Archive it with grzip compression. */
	assertEqualInt(0,
	    systemf("echo f | %s -o --grzip >archive.out 2>archive.err",
	    testprog));
	p = slurpfile(&s, "archive.err");
	free(p);
	/* Check that the archive file has an grzip signature. */
	p = slurpfile(&s, "archive.out");
	assert(s > 2);
	assertEqualMem(p, "GRZipII\x00\x02\x04:)", 12);
	free(p);
}